

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NgammaT.cpp
# Opt level: O3

void __thiscall OpenMD::NgammaT::evolveEtaB(NgammaT *this)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  Mat3x3d *pMVar5;
  uint i;
  long lVar6;
  uint j;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Mat3x3d hmat;
  Mat3x3d local_50;
  
  Snapshot::getHmat(&local_50,(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap
                   );
  uVar3 = (ulong)this->axis_;
  uVar2 = this->axis1_;
  dVar9 = *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           uVar3 * 0x20);
  dVar8 = *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           (ulong)uVar2 * 0x20);
  uVar4 = (ulong)this->axis2_;
  dVar10 = *(double *)
            ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
            uVar4 * 0x20);
  pMVar5 = &this->prevEta_;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      (pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar7] =
           pMVar5[-2].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar7]
      ;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    pMVar5 = (Mat3x3d *)
             ((pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar6 != 3);
  dVar9 = -dVar9;
  dVar11 = (this->super_NPT).targetPressure / 163882576.0;
  dVar1 = *(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + uVar4 * 0x20);
  dVar8 = dVar8 * dVar10 * (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
  dVar10 = (this->super_NPT).NkBT * (this->super_NPT).tb2;
  (this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[uVar3][uVar3] =
       *(double *)
        ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        + uVar3 * 0x20) -
       (((*(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + (ulong)uVar2 * 0x20) - dVar11) * dVar9 -
        this->surfaceTension_) * dVar8) / dVar10;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar4 * 0x20) =
       *(double *)
        ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        + uVar4 * 0x20) - (((dVar1 - dVar11) * dVar9 - this->surfaceTension_) * dVar8) / dVar10;
  (this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[uVar3][uVar3] =
       0.0;
  return;
}

Assistant:

void NgammaT::evolveEtaB() {
    Mat3x3d hmat      = snap->getHmat();
    RealType hz       = hmat(axis_, axis_);
    RealType Axy      = hmat(axis1_, axis1_) * hmat(axis2_, axis2_);
    prevEta_          = eta;
    RealType sx       = -hz * (press(axis1_, axis1_) -
                         targetPressure / Constants::pressureConvert);
    RealType sy       = -hz * (press(axis2_, axis2_) -
                         targetPressure / Constants::pressureConvert);
    eta(axis_, axis_) = oldEta_(axis_, axis_) -
                        dt2 * Axy * (sx - surfaceTension_) / (NkBT * tb2);
    eta(axis2_, axis2_) = oldEta_(axis2_, axis2_) -
                          dt2 * Axy * (sy - surfaceTension_) / (NkBT * tb2);
    eta(axis_, axis_) = 0.0;
  }